

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::UnwrapKeySym
          (SoftHSM *this,CK_MECHANISM_PTR pMechanism,ByteString *wrapped,Token *token,
          OSObject *unwrapKey,ByteString *keydata)

{
  long *plVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  long *plVar6;
  CK_RV CVar7;
  size_t sVar8;
  uchar *__dest;
  undefined8 in_RDX;
  long *in_RSI;
  undefined8 in_R9;
  CK_RV rv;
  ByteString decryptedFinal;
  ByteString iv;
  SymmetricKey *unwrappingkey;
  SymmetricAlgorithm *cipher;
  size_t blocksize;
  size_t bb;
  Type mode;
  Type algo;
  size_t in_stack_fffffffffffffe68;
  ByteString *in_stack_fffffffffffffe70;
  size_t in_stack_fffffffffffffe78;
  undefined7 in_stack_fffffffffffffe80;
  undefined1 in_stack_fffffffffffffe87;
  ByteString *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  SoftHSM *in_stack_fffffffffffffe98;
  OSObject *key;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SymmetricKey *in_stack_ffffffffffffff10;
  SoftHSM *in_stack_ffffffffffffff18;
  CK_RV local_c8;
  undefined1 local_c0 [40];
  undefined1 local_98 [56];
  long *local_60;
  long *local_58;
  size_t local_50;
  long local_48;
  undefined4 local_40;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_20;
  long *local_18;
  CK_RV local_8;
  
  local_40 = 0;
  local_48 = 8;
  local_50 = 0;
  key = (OSObject *)*in_RSI;
  if (key == (OSObject *)0x136) {
    local_3c = 3;
    local_50 = 8;
  }
  else if (key == (OSObject *)0x1085) {
    local_3c = 1;
    local_50 = 0x10;
  }
  else if (key == (OSObject *)0x2109) {
    local_3c = 1;
    local_40 = 1;
  }
  else {
    if (key != (OSObject *)0x210a) {
      return 0x70;
    }
    local_3c = 1;
    local_40 = 2;
  }
  local_38 = in_R9;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pCVar5 = CryptoFactory::i();
  iVar4 = (**pCVar5->_vptr_CryptoFactory)(pCVar5,(ulong)local_3c);
  local_58 = (long *)CONCAT44(extraout_var,iVar4);
  if (local_58 == (long *)0x0) {
    return 0x70;
  }
  plVar6 = (long *)operator_new(0x38);
  SymmetricKey::SymmetricKey
            ((SymmetricKey *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80),
             in_stack_fffffffffffffe78);
  local_60 = plVar6;
  CVar7 = getSymmetricKey(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          (Token *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),key
                         );
  plVar6 = local_60;
  if (CVar7 != 0) {
    (**(code **)(*local_58 + 0x50))(local_58,local_60);
    pCVar5 = CryptoFactory::i();
    (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
    return 5;
  }
  (**(code **)(*local_60 + 0x20))();
  sVar8 = ByteString::size((ByteString *)0x189819);
  (**(code **)(*plVar6 + 0x30))(plVar6,sVar8 * local_48);
  ByteString::ByteString((ByteString *)0x189846);
  ByteString::ByteString((ByteString *)0x189853);
  local_c8 = 0;
  if ((*local_18 == 0x136) || (*local_18 == 0x1085)) {
    ByteString::resize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __dest = ByteString::operator[](in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    memcpy(__dest,(void *)local_18[1],local_50);
    plVar1 = local_58;
    plVar6 = local_60;
    ByteString::ByteString((ByteString *)0x18991a);
    bVar3 = (**(code **)(*plVar1 + 0x28))(plVar1,plVar6,1,local_98,0,0,&stack0xffffffffffffff10,0);
    ByteString::~ByteString((ByteString *)0x189975);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      (**(code **)(*local_58 + 0x50))(local_58,local_60);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
      local_8 = 0x70;
      goto LAB_00189c81;
    }
    bVar3 = (**(code **)(*local_58 + 0x30))(local_58,local_20,local_38);
    if ((bVar3 & 1) == 0) {
      (**(code **)(*local_58 + 0x50))(local_58,local_60);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
      local_8 = 5;
      goto LAB_00189c81;
    }
    bVar3 = (**(code **)(*local_58 + 0x38))(local_58,local_c0);
    if ((bVar3 & 1) == 0) {
      (**(code **)(*local_58 + 0x50))(local_58,local_60);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
      local_8 = 5;
      goto LAB_00189c81;
    }
    ByteString::operator+=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
    bVar2 = RFC5652Unpad(in_stack_fffffffffffffe98,
                         (ByteString *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90)
                         ,(size_t)in_stack_fffffffffffffe88);
    if (!bVar2) {
      (**(code **)(*local_58 + 0x50))(local_58,local_60);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
      local_8 = 5;
      goto LAB_00189c81;
    }
  }
  else {
    local_c8 = 0;
    bVar3 = (**(code **)(*local_58 + 0x48))(local_58,local_60,local_40,local_20,local_38);
    if ((bVar3 & 1) == 0) {
      local_c8 = 5;
    }
  }
  (**(code **)(*local_58 + 0x50))(local_58,local_60);
  pCVar5 = CryptoFactory::i();
  (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_58);
  local_8 = local_c8;
LAB_00189c81:
  ByteString::~ByteString((ByteString *)0x189c8e);
  ByteString::~ByteString((ByteString *)0x189c9b);
  return local_8;
}

Assistant:

CK_RV SoftHSM::UnwrapKeySym
(
	CK_MECHANISM_PTR pMechanism,
	ByteString& wrapped,
	Token* token,
	OSObject* unwrapKey,
	ByteString& keydata
)
{
	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymWrap::Type mode = SymWrap::Unknown;
	size_t bb = 8;
	size_t blocksize = 0;
	
	switch(pMechanism->mechanism) {
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP_PAD;
			break;
#endif
	        case CKM_AES_CBC_PAD:
			algo = SymAlgo::AES;
			blocksize = 16;
			break;
			
	        case CKM_DES3_CBC_PAD:
			algo = SymAlgo::DES3;
			blocksize = 8;
		        break;
		  
		default:
			return CKR_MECHANISM_INVALID;
	}

	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* unwrappingkey = new SymmetricKey();

	if (getSymmetricKey(unwrappingkey, token, unwrapKey) != CKR_OK)
	{
		cipher->recycleKey(unwrappingkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	unwrappingkey->setBitLen(unwrappingkey->getKeyBits().size() * bb);

	ByteString iv;
	ByteString decryptedFinal;
	CK_RV rv = CKR_OK;
	
	switch(pMechanism->mechanism) {

	case CKM_AES_CBC_PAD:
	case CKM_DES3_CBC_PAD:
		iv.resize(blocksize);
		memcpy(&iv[0], pMechanism->pParameter, blocksize);
			
		if (!cipher->decryptInit(unwrappingkey, SymMode::CBC, iv, false))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_MECHANISM_INVALID;
		}
		if (!cipher->decryptUpdate(wrapped, keydata))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR;
		}
		// Finalize encryption
		if (!cipher->decryptFinal(decryptedFinal))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR;
		}
		keydata += decryptedFinal;

		if(!RFC5652Unpad(keydata,blocksize))
		{
			cipher->recycleKey(unwrappingkey);
			CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
			return CKR_GENERAL_ERROR; // TODO should be another error
		}
		break;
		
	default:
		// Unwrap the key
		rv = CKR_OK;
		if (!cipher->unwrapKey(unwrappingkey, mode, wrapped, keydata))
			rv = CKR_GENERAL_ERROR;
	}

	cipher->recycleKey(unwrappingkey);
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
	return rv;
}